

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

_Bool pmu_8_1_events_supported(CPUARMState_conflict *env)

{
  _Bool _Var1;
  uint64_t uVar2;
  
  uVar2 = extract64(env[1].xregs[0x17],8,4);
  if (3 < uVar2) {
    uVar2 = extract64(env[1].xregs[0x17],8,4);
    if (uVar2 != 0xf) {
      return true;
    }
  }
  _Var1 = isar_feature_aa32_pmu_8_1((ARMISARegisters *)(env[1].xregs + 7));
  return _Var1;
}

Assistant:

static bool pmu_8_1_events_supported(CPUARMState *env)
{
    /* For events which are supported in any v8.1 PMU */
    return cpu_isar_feature(any_pmu_8_1, env_archcpu(env));
}